

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

int tnt_iter_map_next(tnt_iter *i)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = (i->data).map.cur_index + 1;
  (i->data).map.cur_index = uVar2;
  bVar3 = (i->data).map.pair_count <= uVar2;
  if (bVar3) {
    i->status = TNT_ITER_FAIL;
  }
  else {
    pcVar1 = *(char **)((long)&i->data + (ulong)(uVar2 != 0) * 0x20 + 8);
    (i->data).array.elem = pcVar1;
    (i->data).array.elem_end = pcVar1;
    mp_next(&(i->data).array.elem_end);
    pcVar1 = (i->data).array.elem_end;
    (i->data).map.value = pcVar1;
    (i->data).map.value_end = pcVar1;
    mp_next(&(i->data).map.value_end);
  }
  return (uint)!bVar3;
}

Assistant:

static int tnt_iter_map_next(struct tnt_iter *i) {
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->pair_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->key = itr->first_key;
	else
		itr->key = itr->value_end;
	itr->key_end = itr->key;
	mp_next(&itr->key_end);
	itr->value = itr->key_end;
	itr->value_end = itr->value;
	mp_next(&itr->value_end);
	return 1;

}